

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

char * google::protobuf::internal::WireFormat::_InternalParseAndMergeField
                 (Message *msg,char *ptr,ParseContext *ctx,uint64_t tag,Reflection *reflection,
                 FieldDescriptor *field)

{
  byte bVar1;
  ushort uVar2;
  int32_t value_00;
  MessageFactory *factory;
  int64_t value_01;
  uint64_t value_02;
  cordz_info_t *pcVar3;
  anon_class_32_4_91646d40 add;
  anon_class_32_4_91646d40 add_00;
  anon_class_32_4_91646d40 add_01;
  bool bVar4;
  bool bVar5;
  uint32_t uVar6;
  CppStringType CVar7;
  int iVar8;
  MessageLite *msg_00;
  RepeatedField<double> *object;
  UnknownFieldSet *pUVar9;
  char *pcVar10;
  Descriptor *this;
  FieldDescriptor *pFVar11;
  EnumDescriptor *this_00;
  EnumValueDescriptor *pEVar12;
  RepeatedField<long> *pRVar13;
  RepeatedField<unsigned_int> *pRVar14;
  RepeatedField<bool> *object_00;
  RepeatedField<float> *object_01;
  RepeatedField<unsigned_long> *pRVar15;
  RepeatedField<int> *pRVar16;
  anon_union_16_2_39e9c77e_for_Rep_0 *this_01;
  int iVar17;
  long lVar18;
  char *pcVar19;
  uint uVar20;
  string *value_03;
  Metadata MVar21;
  string_view field_name;
  string_view field_name_00;
  uint32_t value;
  char *local_e0;
  anon_union_16_2_39e9c77e_for_Rep_0 local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  double local_b8;
  char *local_b0;
  anon_union_16_2_39e9c77e_for_Rep_0 local_a8;
  undefined8 local_98;
  undefined2 local_90;
  anon_enum_32 local_84;
  string local_80;
  string local_60;
  anon_union_16_2_39e9c77e_for_Rep_0 local_40;
  
  local_e0 = ptr;
  if (field == (FieldDescriptor *)0x0) {
LAB_003b6327:
    pUVar9 = Reflection::MutableUnknownFields(reflection,msg);
    pcVar10 = UnknownFieldParse(tag,pUVar9,ptr,ctx);
    return pcVar10;
  }
  uVar20 = (uint)tag & 7;
  bVar1 = field->type_;
  pFVar11 = field;
  if (uVar20 != *(uint *)(WireFormatLite::kWireTypeForFieldType + (ulong)bVar1 * 4)) {
    bVar5 = FieldDescriptor::is_packable(field);
    if (uVar20 != 2 || !bVar5) goto LAB_003b6327;
    bVar1 = field->type_;
    switch(bVar1) {
    case 1:
      object = Reflection::MutableRepeatedFieldInternal<double>(reflection,msg,field);
      pcVar10 = PackedDoubleParser(object,ptr,ctx);
      return pcVar10;
    case 2:
      object_01 = Reflection::MutableRepeatedFieldInternal<float>(reflection,msg,field);
      pcVar10 = PackedFloatParser(object_01,ptr,ctx);
      return pcVar10;
    case 3:
      pRVar13 = Reflection::MutableRepeatedFieldInternal<long>(reflection,msg,field);
      pcVar10 = PackedInt64Parser(pRVar13,ptr,ctx);
      return pcVar10;
    case 4:
      pRVar15 = Reflection::MutableRepeatedFieldInternal<unsigned_long>(reflection,msg,field);
      pcVar10 = PackedUInt64Parser(pRVar15,ptr,ctx);
      return pcVar10;
    case 5:
      pRVar16 = Reflection::MutableRepeatedFieldInternal<int>(reflection,msg,field);
      pcVar10 = PackedInt32Parser(pRVar16,ptr,ctx);
      return pcVar10;
    case 6:
      pRVar15 = Reflection::MutableRepeatedFieldInternal<unsigned_long>(reflection,msg,field);
      pcVar10 = PackedFixed64Parser(pRVar15,ptr,ctx);
      return pcVar10;
    case 7:
      pRVar14 = Reflection::MutableRepeatedFieldInternal<unsigned_int>(reflection,msg,field);
      pcVar10 = PackedFixed32Parser(pRVar14,ptr,ctx);
      return pcVar10;
    case 8:
      object_00 = Reflection::MutableRepeatedFieldInternal<bool>(reflection,msg,field);
      pcVar10 = PackedBoolParser(object_00,ptr,ctx);
      return pcVar10;
    case 9:
    case 10:
    case 0xb:
    case 0xc:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_d8.as_tree,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.cc"
                 ,0x378);
      absl::lts_20250127::log_internal::LogMessage::operator<<
                ((LogMessage *)&local_d8.as_tree,(char (*) [12])"Can\'t reach");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_d8.as_tree);
    case 0xd:
      pRVar14 = Reflection::MutableRepeatedFieldInternal<unsigned_int>(reflection,msg,field);
      pcVar10 = PackedUInt32Parser(pRVar14,ptr,ctx);
      return pcVar10;
    case 0xe:
      pRVar16 = Reflection::MutableRepeatedFieldInternal<int>(reflection,msg,field);
      bVar5 = FieldDescriptor::legacy_enum_field_treated_as_closed(field);
      if (!bVar5) {
        pcVar10 = PackedEnumParser(pRVar16,ptr,ctx);
        return pcVar10;
      }
      local_d8.as_tree.cordz_info = (cordz_info_t)pRVar16;
      local_d8.as_tree.rep = (CordRep *)field;
      local_c8._M_allocated_capacity = (size_type)reflection;
      local_c8._8_8_ = msg;
      local_b0 = ptr;
      uVar6 = ReadSize(&local_b0);
      if (local_b0 == (char *)0x0) {
        return (char *)0x0;
      }
      pcVar10 = (ctx->super_EpsCopyInputStream).buffer_end_;
      lVar18 = (long)pcVar10 - (long)local_b0;
      while( true ) {
        iVar17 = (int)lVar18;
        iVar8 = uVar6 - iVar17;
        if (iVar8 == 0 || (int)uVar6 < iVar17) {
          pcVar19 = local_b0 + (int)uVar6;
          add_00.field = (FieldDescriptor *)local_d8.as_tree.rep;
          add_00.rep_enum = (RepeatedField<int> *)local_d8.as_tree.cordz_info;
          add_00.reflection = (Reflection *)local_c8._M_allocated_capacity;
          add_00.msg = (Message *)local_c8._8_8_;
          pcVar10 = ReadPackedVarintArray<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
                              (local_b0,pcVar19,add_00);
          if (pcVar19 == pcVar10) {
            return pcVar10;
          }
          return (char *)0x0;
        }
        add.field = (FieldDescriptor *)local_d8.as_tree.rep;
        add.rep_enum = (RepeatedField<int> *)local_d8.as_tree.cordz_info;
        add.reflection = (Reflection *)local_c8._M_allocated_capacity;
        add.msg = (Message *)local_c8._8_8_;
        local_b0 = ReadPackedVarintArray<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
                             (local_b0,pcVar10,add);
        if (local_b0 == (char *)0x0) {
          return (char *)0x0;
        }
        pcVar3 = (cordz_info_t *)(ctx->super_EpsCopyInputStream).buffer_end_;
        uVar20 = (int)local_b0 - (int)pcVar3;
        if (0x10 < uVar20) {
          pcVar19 = 
          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
          ;
          pcVar10 = "overrun >= 0 && overrun <= kSlopBytes";
          this_01 = &local_a8;
          iVar8 = 0x50b;
          goto LAB_003b6fde;
        }
        if (iVar8 < 0x11) break;
        uVar6 = uVar6 - (iVar17 + uVar20);
        pcVar10 = absl::lts_20250127::log_internal::Check_GTImpl(uVar6,0,"size > 0");
        if (pcVar10 != (Nullable<const_char_*>)0x0) {
          this_01 = &local_a8;
          iVar8 = 0x519;
          goto LAB_003b6fff;
        }
        if ((ctx->super_EpsCopyInputStream).limit_ < 0x11) {
          return (char *)0x0;
        }
        local_b0 = EpsCopyInputStream::Next(&ctx->super_EpsCopyInputStream);
        if (local_b0 == (char *)0x0) {
          return (char *)0x0;
        }
        local_b0 = local_b0 + (uVar20 & 0x1f);
        pcVar10 = (ctx->super_EpsCopyInputStream).buffer_end_;
        lVar18 = (long)pcVar10 - (long)local_b0;
      }
      local_90 = 0;
      local_98 = 0;
      local_a8.as_tree.cordz_info = *pcVar3;
      local_a8.as_tree.rep = (CordRep *)pcVar3[1];
      local_84 = kSlopBytes;
      local_40.as_tree.cordz_info._0_4_ = iVar8;
      pcVar10 = absl::lts_20250127::log_internal::
                Check_LEImpl<int,google::protobuf::internal::EpsCopyInputStream::_unnamed_type_2_>
                          ((int *)local_40.data,&local_84,"size - chunk_size <= kSlopBytes");
      if (pcVar10 == (Nullable<const_char_*>)0x0) {
        pcVar19 = (char *)((long)&local_a8.as_tree.cordz_info + (long)iVar8);
        add_01.field = (FieldDescriptor *)local_d8.as_tree.rep;
        add_01.rep_enum = (RepeatedField<int> *)local_d8.as_tree.cordz_info;
        add_01.reflection = (Reflection *)local_c8._M_allocated_capacity;
        add_01.msg = (Message *)local_c8._8_8_;
        pcVar10 = ReadPackedVarintArray<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
                            ((char *)((long)&local_a8.as_tree.cordz_info + (ulong)(uVar20 & 0x1f)),
                             pcVar19,add_01);
        if (pcVar10 == pcVar19) {
          return (ctx->super_EpsCopyInputStream).buffer_end_ + ((long)pcVar10 - (long)&local_a8);
        }
        return (char *)0x0;
      }
      this_01 = &local_40;
      iVar8 = 0x512;
LAB_003b6fff:
      pcVar19 = 
      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
      ;
      goto LAB_003b6fde;
    case 0xf:
      pRVar16 = Reflection::MutableRepeatedFieldInternal<int>(reflection,msg,field);
      pcVar10 = PackedSFixed32Parser(pRVar16,ptr,ctx);
      return pcVar10;
    case 0x10:
      pRVar13 = Reflection::MutableRepeatedFieldInternal<long>(reflection,msg,field);
      pcVar10 = PackedSFixed64Parser(pRVar13,ptr,ctx);
      return pcVar10;
    case 0x11:
      pRVar16 = Reflection::MutableRepeatedFieldInternal<int>(reflection,msg,field);
      pcVar10 = PackedSInt32Parser(pRVar16,ptr,ctx);
      return pcVar10;
    case 0x12:
      pRVar13 = Reflection::MutableRepeatedFieldInternal<long>(reflection,msg,field);
      pcVar10 = PackedSInt64Parser(pRVar13,ptr,ctx);
      return pcVar10;
    }
  }
  bVar5 = false;
  switch(bVar1) {
  case 1:
    local_b8 = *(double *)ptr;
    bVar5 = FieldDescriptor::is_repeated(field);
    if (!bVar5) {
      Reflection::SetDouble(reflection,msg,field,local_b8);
      return ptr + 8;
    }
    Reflection::AddDouble(reflection,msg,field,local_b8);
    return ptr + 8;
  case 2:
    local_b8 = (double)CONCAT44(local_b8._4_4_,*(undefined4 *)ptr);
    bVar5 = FieldDescriptor::is_repeated(field);
    if (!bVar5) {
      Reflection::SetFloat(reflection,msg,field,local_b8._0_4_);
      return ptr + 4;
    }
    Reflection::AddFloat(reflection,msg,field,local_b8._0_4_);
    return ptr + 4;
  case 3:
    local_e0 = VarintParse<unsigned_long>(ptr,(unsigned_long *)local_d8.data);
    if (local_e0 != (char *)0x0) {
      bVar5 = FieldDescriptor::is_repeated(field);
      if (bVar5) {
LAB_003b660a:
        Reflection::AddInt64(reflection,msg,field,local_d8.as_tree.cordz_info);
        return local_e0;
      }
LAB_003b6d48:
      Reflection::SetInt64(reflection,msg,field,local_d8.as_tree.cordz_info);
      return local_e0;
    }
    break;
  case 4:
    local_e0 = VarintParse<unsigned_long>(ptr,(unsigned_long *)local_d8.data);
    if (local_e0 != (char *)0x0) {
      bVar5 = FieldDescriptor::is_repeated(field);
      if (!bVar5) {
        Reflection::SetUInt64(reflection,msg,field,local_d8.as_tree.cordz_info);
        return local_e0;
      }
      Reflection::AddUInt64(reflection,msg,field,local_d8.as_tree.cordz_info);
      return local_e0;
    }
    break;
  case 5:
    local_e0 = VarintParse<unsigned_int>(ptr,(uint *)local_d8.data);
    if (local_e0 != (char *)0x0) {
      bVar5 = FieldDescriptor::is_repeated(field);
      if (bVar5) {
LAB_003b63ff:
        Reflection::AddInt32(reflection,msg,field,local_d8.as_tree.cordz_info._0_4_);
        return local_e0;
      }
LAB_003b6ce0:
      Reflection::SetInt32(reflection,msg,field,local_d8.as_tree.cordz_info._0_4_);
      return local_e0;
    }
    break;
  case 6:
    value_02 = *(uint64_t *)ptr;
    bVar5 = FieldDescriptor::is_repeated(field);
    if (!bVar5) {
      Reflection::SetUInt64(reflection,msg,field,value_02);
      return ptr + 8;
    }
    Reflection::AddUInt64(reflection,msg,field,value_02);
    return ptr + 8;
  case 7:
    uVar6 = *(uint32_t *)ptr;
    bVar5 = FieldDescriptor::is_repeated(field);
    if (!bVar5) {
      Reflection::SetUInt32(reflection,msg,field,uVar6);
      return ptr + 4;
    }
    Reflection::AddUInt32(reflection,msg,field,uVar6);
    return ptr + 4;
  case 8:
    local_e0 = VarintParse<unsigned_long>(ptr,(unsigned_long *)local_d8.data);
    if (local_e0 != (char *)0x0) {
      bVar5 = FieldDescriptor::is_repeated(field);
      if (!bVar5) {
        Reflection::SetBool(reflection,msg,field,
                            (RepeatedField<int> *)local_d8.as_tree.cordz_info !=
                            (RepeatedField<int> *)0x0);
        return local_e0;
      }
      Reflection::AddBool(reflection,msg,field,
                          (RepeatedField<int> *)local_d8.as_tree.cordz_info !=
                          (RepeatedField<int> *)0x0);
      return local_e0;
    }
    break;
  case 9:
    bVar5 = FieldDescriptor::requires_utf8_validation(field);
    bVar4 = true;
    goto LAB_003b6683;
  case 10:
  case 0xb:
    bVar5 = FieldDescriptor::is_repeated(field);
    factory = (ctx->data_).factory;
    if (bVar5) {
      msg_00 = &Reflection::AddMessage(reflection,msg,field,factory)->super_MessageLite;
    }
    else {
      msg_00 = &Reflection::MutableMessage(reflection,msg,field,factory)->super_MessageLite;
    }
    if (uVar20 == 3) {
      pcVar10 = ParseContext::ParseGroup(ctx,msg_00,ptr,(uint)tag);
      return pcVar10;
    }
    if (uVar20 != 2) {
      pcVar19 = 
      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.cc"
      ;
      pcVar10 = "WireFormatLite::GetTagWireType(tag) == WireFormatLite::WIRETYPE_LENGTH_DELIMITED";
      this_01 = &local_d8;
      iVar8 = 0x2fc;
LAB_003b6fde:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&this_01->as_tree,pcVar19,iVar8,pcVar10);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&this_01->as_tree);
    }
    pcVar10 = ParseContext::ParseMessage(ctx,msg_00,ptr);
    if (pcVar10 != (char *)0x0) {
      bVar5 = FieldDescriptor::is_map(field);
      if (!bVar5) {
        return pcVar10;
      }
      this = FieldDescriptor::message_type(field);
      pFVar11 = Descriptor::map_value(this);
      this_00 = FieldDescriptor::enum_type(pFVar11);
      if (this_00 == (EnumDescriptor *)0x0) {
        return pcVar10;
      }
      bVar5 = cpp::HasPreservingUnknownEnumSemantics(pFVar11);
      if (bVar5) {
        return pcVar10;
      }
      MVar21 = Message::GetMetadata((Message *)msg_00);
      iVar8 = Reflection::GetEnumValue(MVar21.reflection,(Message *)msg_00,pFVar11);
      pEVar12 = EnumDescriptor::FindValueByNumber(this_00,iVar8);
      if (pEVar12 == (EnumValueDescriptor *)0x0) {
        pUVar9 = Reflection::MutableUnknownFields(reflection,msg);
        iVar8 = field->number_;
        MessageLite::SerializeAsString_abi_cxx11_((string *)&local_d8.as_tree,msg_00);
        UnknownFieldSet::AddLengthDelimited<>(pUVar9,iVar8,(string *)&local_d8.as_tree);
        std::__cxx11::string::~string((string *)&local_d8.as_tree);
        Reflection::RemoveLast(reflection,msg,field);
        return pcVar10;
      }
      return pcVar10;
    }
    break;
  case 0xc:
    bVar4 = false;
LAB_003b6683:
    uVar6 = ReadSize(&local_e0);
    if (local_e0 == (char *)0x0) {
      return (char *)0x0;
    }
    CVar7 = FieldDescriptor::cpp_string_type(field);
    if (CVar7 == kCord) {
      local_d8.as_tree.cordz_info = 0;
      local_d8.as_tree.rep = (CordRep *)0x0;
      local_e0 = EpsCopyInputStream::ReadCord
                           (&ctx->super_EpsCopyInputStream,local_e0,uVar6,(Cord *)&local_d8.as_tree)
      ;
      if (local_e0 == (char *)0x0) {
        pcVar10 = (char *)0x0;
      }
      else {
        Reflection::SetString(reflection,msg,field,(Cord *)&local_d8.as_tree);
        pcVar10 = local_e0;
      }
      absl::lts_20250127::Cord::~Cord((Cord *)&local_d8.as_tree);
      return pcVar10;
    }
    local_d8.as_tree.rep = (CordRep *)0x0;
    local_c8._M_allocated_capacity = local_c8._M_allocated_capacity & 0xffffffffffffff00;
    local_d8.as_tree.cordz_info = (cordz_info_t)&local_c8;
    local_e0 = EpsCopyInputStream::ReadString
                         (&ctx->super_EpsCopyInputStream,local_e0,uVar6,(string *)&local_d8.as_tree)
    ;
    if (local_e0 == (char *)0x0) {
LAB_003b68cd:
      pcVar10 = (char *)0x0;
    }
    else {
      if (bVar4) {
        pcVar10 = (field->all_names_).payload_;
        uVar2 = *(ushort *)(pcVar10 + 2);
        field_name._M_len = pcVar10 + ~(ulong)uVar2;
        if (bVar5 == false) {
          field_name_00._M_str = (char *)pFVar11;
          field_name_00._M_len = (size_t)field_name._M_len;
          WireFormatLite::VerifyUtf8String
                    ((WireFormatLite *)local_d8.as_tree.cordz_info,
                     (char *)((ulong)local_d8.as_tree.rep & 0xffffffff),0,(uint)uVar2,field_name_00)
          ;
        }
        else {
          field_name._M_str = (char *)pFVar11;
          bVar5 = WireFormatLite::VerifyUtf8String
                            ((WireFormatLite *)local_d8.as_tree.cordz_info,
                             (char *)((ulong)local_d8.as_tree.rep & 0xffffffff),0,(uint)uVar2,
                             field_name);
          if (!bVar5) goto LAB_003b68cd;
        }
      }
      bVar5 = FieldDescriptor::is_repeated(field);
      if (bVar5) {
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8.as_tree.cordz_info == &local_c8) {
          local_60.field_2._8_8_ = local_c8._8_8_;
        }
        else {
          local_60._M_dataplus._M_p = (pointer)local_d8.as_tree.cordz_info;
        }
        local_60.field_2._M_allocated_capacity = local_c8._M_allocated_capacity;
        value_03 = &local_60;
        local_60._M_string_length = (size_type)local_d8.as_tree.rep;
        local_d8.as_tree.rep = (CordRep *)0x0;
        local_c8._M_allocated_capacity = (ulong)(uint7)local_c8._M_allocated_capacity._1_7_ << 8;
        local_d8.as_tree.cordz_info = (cordz_info_t)&local_c8;
        Reflection::AddString(reflection,msg,field,value_03);
      }
      else {
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8.as_tree.cordz_info == &local_c8) {
          local_80.field_2._8_8_ = local_c8._8_8_;
        }
        else {
          local_80._M_dataplus._M_p = (pointer)local_d8.as_tree.cordz_info;
        }
        local_80.field_2._M_allocated_capacity = local_c8._M_allocated_capacity;
        value_03 = &local_80;
        local_80._M_string_length = (size_type)local_d8.as_tree.rep;
        local_d8.as_tree.rep = (CordRep *)0x0;
        local_c8._M_allocated_capacity = (ulong)(uint7)local_c8._M_allocated_capacity._1_7_ << 8;
        local_d8.as_tree.cordz_info = (cordz_info_t)&local_c8;
        Reflection::SetString(reflection,msg,field,value_03);
      }
      std::__cxx11::string::~string((string *)value_03);
      pcVar10 = local_e0;
    }
    std::__cxx11::string::~string((string *)&local_d8.as_tree);
    return pcVar10;
  case 0xd:
    local_e0 = VarintParse<unsigned_int>(ptr,(uint *)local_d8.data);
    if (local_e0 != (char *)0x0) {
      bVar5 = FieldDescriptor::is_repeated(field);
      if (!bVar5) {
        Reflection::SetUInt32(reflection,msg,field,local_d8.as_tree.cordz_info._0_4_);
        return local_e0;
      }
      Reflection::AddUInt32(reflection,msg,field,local_d8.as_tree.cordz_info._0_4_);
      return local_e0;
    }
    break;
  case 0xe:
    local_e0 = VarintParse<unsigned_int>(ptr,(uint *)local_d8.data);
    if (local_e0 != (char *)0x0) {
      bVar5 = FieldDescriptor::is_repeated(field);
      if (!bVar5) {
        Reflection::SetEnumValue(reflection,msg,field,local_d8.as_tree.cordz_info._0_4_);
        return local_e0;
      }
      Reflection::AddEnumValue(reflection,msg,field,local_d8.as_tree.cordz_info._0_4_);
      return local_e0;
    }
    break;
  case 0xf:
    value_00 = *(int32_t *)ptr;
    bVar5 = FieldDescriptor::is_repeated(field);
    if (!bVar5) {
      Reflection::SetInt32(reflection,msg,field,value_00);
      return ptr + 4;
    }
    Reflection::AddInt32(reflection,msg,field,value_00);
    return ptr + 4;
  case 0x10:
    value_01 = *(int64_t *)ptr;
    bVar5 = FieldDescriptor::is_repeated(field);
    if (!bVar5) {
      Reflection::SetInt64(reflection,msg,field,value_01);
      return ptr + 8;
    }
    Reflection::AddInt64(reflection,msg,field,value_01);
    return ptr + 8;
  case 0x11:
    local_d8.as_tree.cordz_info._0_4_ = ReadVarintZigZag32(&local_e0);
    if (local_e0 != (char *)0x0) {
      bVar5 = FieldDescriptor::is_repeated(field);
      if (bVar5) goto LAB_003b63ff;
      goto LAB_003b6ce0;
    }
    break;
  case 0x12:
    local_d8.as_tree.cordz_info = ReadVarintZigZag64(&local_e0);
    if (local_e0 != (char *)0x0) {
      bVar5 = FieldDescriptor::is_repeated(field);
      if (bVar5) goto LAB_003b660a;
      goto LAB_003b6d48;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* WireFormat::_InternalParseAndMergeField(
    Message* msg, const char* ptr, internal::ParseContext* ctx, uint64_t tag,
    const Reflection* reflection, const FieldDescriptor* field) {
  if (field == nullptr) {
    // unknown field set parser takes 64bit tags, because message set type ids
    // span the full 32 bit range making the tag span [0, 2^35) range.
    return internal::UnknownFieldParse(
        tag, reflection->MutableUnknownFields(msg), ptr, ctx);
  }
  if (WireFormatLite::GetTagWireType(tag) !=
      WireTypeForFieldType(field->type())) {
    if (field->is_packable() && WireFormatLite::GetTagWireType(tag) ==
                                    WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
      switch (field->type()) {
#define HANDLE_PACKED_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)                   \
  case FieldDescriptor::TYPE_##TYPE: {                                      \
    ptr = internal::Packed##CPPTYPE_METHOD##Parser(                         \
        reflection->MutableRepeatedFieldInternal<CPPTYPE>(msg, field), ptr, \
        ctx);                                                               \
    return ptr;                                                             \
  }

        HANDLE_PACKED_TYPE(INT32, int32_t, Int32)
        HANDLE_PACKED_TYPE(INT64, int64_t, Int64)
        HANDLE_PACKED_TYPE(SINT32, int32_t, SInt32)
        HANDLE_PACKED_TYPE(SINT64, int64_t, SInt64)
        HANDLE_PACKED_TYPE(UINT32, uint32_t, UInt32)
        HANDLE_PACKED_TYPE(UINT64, uint64_t, UInt64)

        HANDLE_PACKED_TYPE(FIXED32, uint32_t, Fixed32)
        HANDLE_PACKED_TYPE(FIXED64, uint64_t, Fixed64)
        HANDLE_PACKED_TYPE(SFIXED32, int32_t, SFixed32)
        HANDLE_PACKED_TYPE(SFIXED64, int64_t, SFixed64)

        HANDLE_PACKED_TYPE(FLOAT, float, Float)
        HANDLE_PACKED_TYPE(DOUBLE, double, Double)

        HANDLE_PACKED_TYPE(BOOL, bool, Bool)
#undef HANDLE_PACKED_TYPE

        case FieldDescriptor::TYPE_ENUM: {
          auto rep_enum =
              reflection->MutableRepeatedFieldInternal<int>(msg, field);
          if (!field->legacy_enum_field_treated_as_closed()) {
            ptr = internal::PackedEnumParser(rep_enum, ptr, ctx);
          } else {
            return ctx->ReadPackedVarint(
                ptr, [rep_enum, field, reflection, msg](int32_t val) {
                  if (field->enum_type()->FindValueByNumber(val) != nullptr) {
                    rep_enum->Add(val);
                  } else {
                    WriteVarint(field->number(), val,
                                reflection->MutableUnknownFields(msg));
                  }
                });
          }
          return ptr;
        }

        case FieldDescriptor::TYPE_STRING:
        case FieldDescriptor::TYPE_GROUP:
        case FieldDescriptor::TYPE_MESSAGE:
        case FieldDescriptor::TYPE_BYTES:
          ABSL_LOG(FATAL) << "Can't reach";
          return nullptr;
      }
    } else {
      // mismatched wiretype;
      return internal::UnknownFieldParse(
          tag, reflection->MutableUnknownFields(msg), ptr, ctx);
    }
  }

  // Non-packed value
  bool utf8_check = false;
  bool strict_utf8_check = false;
  switch (field->type()) {
#define HANDLE_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)        \
  case FieldDescriptor::TYPE_##TYPE: {                    \
    CPPTYPE value;                                        \
    ptr = VarintParse(ptr, &value);                       \
    if (ptr == nullptr) return nullptr;                   \
    if (field->is_repeated()) {                           \
      reflection->Add##CPPTYPE_METHOD(msg, field, value); \
    } else {                                              \
      reflection->Set##CPPTYPE_METHOD(msg, field, value); \
    }                                                     \
    return ptr;                                           \
  }

    HANDLE_TYPE(BOOL, uint64_t, Bool)
    HANDLE_TYPE(INT32, uint32_t, Int32)
    HANDLE_TYPE(INT64, uint64_t, Int64)
    HANDLE_TYPE(UINT32, uint32_t, UInt32)
    HANDLE_TYPE(UINT64, uint64_t, UInt64)

    case FieldDescriptor::TYPE_SINT32: {
      int32_t value = ReadVarintZigZag32(&ptr);
      if (ptr == nullptr) return nullptr;
      if (field->is_repeated()) {
        reflection->AddInt32(msg, field, value);
      } else {
        reflection->SetInt32(msg, field, value);
      }
      return ptr;
    }
    case FieldDescriptor::TYPE_SINT64: {
      int64_t value = ReadVarintZigZag64(&ptr);
      if (ptr == nullptr) return nullptr;
      if (field->is_repeated()) {
        reflection->AddInt64(msg, field, value);
      } else {
        reflection->SetInt64(msg, field, value);
      }
      return ptr;
    }
#undef HANDLE_TYPE
#define HANDLE_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)        \
  case FieldDescriptor::TYPE_##TYPE: {                    \
    CPPTYPE value;                                        \
    value = UnalignedLoad<CPPTYPE>(ptr);                  \
    ptr += sizeof(CPPTYPE);                               \
    if (field->is_repeated()) {                           \
      reflection->Add##CPPTYPE_METHOD(msg, field, value); \
    } else {                                              \
      reflection->Set##CPPTYPE_METHOD(msg, field, value); \
    }                                                     \
    return ptr;                                           \
  }

      HANDLE_TYPE(FIXED32, uint32_t, UInt32)
      HANDLE_TYPE(FIXED64, uint64_t, UInt64)
      HANDLE_TYPE(SFIXED32, int32_t, Int32)
      HANDLE_TYPE(SFIXED64, int64_t, Int64)

      HANDLE_TYPE(FLOAT, float, Float)
      HANDLE_TYPE(DOUBLE, double, Double)

#undef HANDLE_TYPE

    case FieldDescriptor::TYPE_ENUM: {
      uint32_t value;
      ptr = VarintParse(ptr, &value);
      if (ptr == nullptr) return nullptr;
      if (field->is_repeated()) {
        reflection->AddEnumValue(msg, field, value);
      } else {
        reflection->SetEnumValue(msg, field, value);
      }
      return ptr;
    }

    // Handle strings separately so that we can optimize the ctype=CORD case.
    case FieldDescriptor::TYPE_STRING:
      utf8_check = true;
      strict_utf8_check = field->requires_utf8_validation();
      ABSL_FALLTHROUGH_INTENDED;
    case FieldDescriptor::TYPE_BYTES: {
      int size = ReadSize(&ptr);
      if (ptr == nullptr) return nullptr;
      if (field->cpp_string_type() == FieldDescriptor::CppStringType::kCord) {
        absl::Cord value;
        ptr = ctx->ReadCord(ptr, size, &value);
        if (ptr == nullptr) return nullptr;
        reflection->SetString(msg, field, value);
        return ptr;
      }
      std::string value;
      ptr = ctx->ReadString(ptr, size, &value);
      if (ptr == nullptr) return nullptr;
      if (utf8_check) {
        if (strict_utf8_check) {
          if (!WireFormatLite::VerifyUtf8String(value.data(), value.length(),
                                                WireFormatLite::PARSE,
                                                field->full_name())) {
            return nullptr;
          }
        } else {
          VerifyUTF8StringNamedField(value.data(), value.length(), PARSE,
                                     field->full_name());
        }
      }
      if (field->is_repeated()) {
        reflection->AddString(msg, field, std::move(value));
      } else {
        reflection->SetString(msg, field, std::move(value));
      }
      return ptr;
    }

    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP:
      return HandleMessage(msg, ptr, ctx, tag, reflection, field);
  }

  // GCC 8 complains about control reaching end of non-void function here.
  // Let's keep it happy by returning a nullptr.
  return nullptr;
}